

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O0

void iemgui_init_sym2dollararg(t_iemgui *iemgui,t_symbol **symp,int indx,t_symbol *fallback)

{
  _binbuf *x;
  int iVar1;
  t_atom *ptVar2;
  t_symbol *ptVar3;
  char **local_90;
  char *buf;
  char astring [80];
  t_atom *a;
  _binbuf *b;
  t_symbol *fallback_local;
  int indx_local;
  t_symbol **symp_local;
  t_iemgui *iemgui_local;
  
  x = (iemgui->x_obj).te_binbuf;
  if ((*symp == (t_symbol *)0x0) && (iVar1 = binbuf_getnatom(x), indx < iVar1)) {
    ptVar2 = binbuf_getvec(x);
    astring._72_8_ = ptVar2 + indx;
    local_90 = &buf;
    if (((t_atom *)astring._72_8_)->a_type == A_SYMBOL) {
      ptVar3 = atom_getsymbol((t_atom *)astring._72_8_);
      local_90 = (char **)ptVar3->s_name;
    }
    else {
      atom_string((t_atom *)astring._72_8_,(char *)&buf,0x50);
    }
    iVar1 = strcmp((char *)local_90,"empty");
    if (iVar1 != 0) {
      ptVar3 = gensym((char *)local_90);
      *symp = ptVar3;
    }
  }
  if (*symp == (t_symbol *)0x0) {
    *symp = fallback;
  }
  return;
}

Assistant:

static void iemgui_init_sym2dollararg(t_iemgui *iemgui, t_symbol **symp,
    int indx, t_symbol *fallback)
{
    t_binbuf *b = iemgui->x_obj.ob_binbuf;
    if ((!*symp) && (binbuf_getnatom(b) > indx))
    {
        t_atom *a = binbuf_getvec(b) + indx;
        char astring[80];
        const char *buf = astring;
        if(A_SYMBOL == a->a_type)
        {
            buf = atom_getsymbol(a)->s_name;
        } else {
            atom_string(a, astring, sizeof(astring));
        }
        if(strcmp(buf, "empty"))
            *symp = gensym(buf);
    }
    if (!*symp)
        *symp = fallback;
}